

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305_vec.cc
# Opt level: O0

void CRYPTO_poly1305_update(poly1305_state *state,uint8_t *m,size_t bytes)

{
  poly1305_state_internal *st_00;
  size_t sVar1;
  ulong bytes_00;
  size_t want;
  poly1305_state_internal *st;
  size_t bytes_local;
  uint8_t *m_local;
  poly1305_state *state_local;
  
  st_00 = poly1305_aligned_state(state);
  if (bytes != 0) {
    st = (poly1305_state_internal *)bytes;
    bytes_local = (size_t)m;
    if (st_00->started == 0) {
      if ((st_00->leftover == 0) && (0x20 < bytes)) {
        poly1305_first_block(st_00,m);
        bytes_local = (size_t)(m + 0x20);
        st = (poly1305_state_internal *)(bytes - 0x20);
      }
      else {
        sVar1 = poly1305_min(0x20 - st_00->leftover,bytes);
        OPENSSL_memcpy(st_00->buffer + st_00->leftover,m,sVar1);
        st = (poly1305_state_internal *)(bytes - sVar1);
        bytes_local = (size_t)(m + sVar1);
        st_00->leftover = sVar1 + st_00->leftover;
        if (st_00->leftover < 0x20) {
          return;
        }
        if (st == (poly1305_state_internal *)0x0) {
          return;
        }
        poly1305_first_block(st_00,st_00->buffer);
        st_00->leftover = 0;
      }
      st_00->started = 1;
    }
    if (st_00->leftover != 0) {
      sVar1 = poly1305_min(0x40 - st_00->leftover,(size_t)st);
      OPENSSL_memcpy(st_00->buffer + st_00->leftover,(void *)bytes_local,sVar1);
      st = (poly1305_state_internal *)((long)st - sVar1);
      bytes_local = sVar1 + bytes_local;
      st_00->leftover = sVar1 + st_00->leftover;
      if (st_00->leftover < 0x40) {
        return;
      }
      poly1305_blocks(st_00,st_00->buffer,0x40);
      st_00->leftover = 0;
    }
    if ((poly1305_state_internal *)0x3f < st) {
      bytes_00 = (ulong)st & 0xffffffffffffffc0;
      poly1305_blocks(st_00,(uint8_t *)bytes_local,bytes_00);
      bytes_local = bytes_00 + bytes_local;
      st = (poly1305_state_internal *)((long)st - bytes_00);
    }
    if (st != (poly1305_state_internal *)0x0) {
      OPENSSL_memcpy(st_00->buffer + st_00->leftover,(void *)bytes_local,(size_t)st);
      st_00->leftover = (long)&st->P[0].R20 + st_00->leftover;
    }
  }
  return;
}

Assistant:

void CRYPTO_poly1305_update(poly1305_state *state, const uint8_t *m,
                            size_t bytes) {
  poly1305_state_internal *st = poly1305_aligned_state(state);
  size_t want;

  // Work around a C language bug. See https://crbug.com/1019588.
  if (bytes == 0) {
    return;
  }

  // need at least 32 initial bytes to start the accelerated branch
  if (!st->started) {
    if ((st->leftover == 0) && (bytes > 32)) {
      poly1305_first_block(st, m);
      m += 32;
      bytes -= 32;
    } else {
      want = poly1305_min(32 - st->leftover, bytes);
      OPENSSL_memcpy(st->buffer + st->leftover, m, want);
      bytes -= want;
      m += want;
      st->leftover += want;
      if ((st->leftover < 32) || (bytes == 0)) {
        return;
      }
      poly1305_first_block(st, st->buffer);
      st->leftover = 0;
    }
    st->started = 1;
  }

  // handle leftover
  if (st->leftover) {
    want = poly1305_min(64 - st->leftover, bytes);
    OPENSSL_memcpy(st->buffer + st->leftover, m, want);
    bytes -= want;
    m += want;
    st->leftover += want;
    if (st->leftover < 64) {
      return;
    }
    poly1305_blocks(st, st->buffer, 64);
    st->leftover = 0;
  }

  // process 64 byte blocks
  if (bytes >= 64) {
    want = (bytes & ~63);
    poly1305_blocks(st, m, want);
    m += want;
    bytes -= want;
  }

  if (bytes) {
    OPENSSL_memcpy(st->buffer + st->leftover, m, bytes);
    st->leftover += bytes;
  }
}